

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall
QtMWidgets::TableViewSection::TableViewSection(TableViewSection *this,QWidget *parent)

{
  TableViewSectionPrivate *this_00;
  TableViewSectionPrivate *this_01;
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  TableViewSection *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_002345c0;
  *(undefined ***)&this->field_0x10 = &PTR__TableViewSection_00234770;
  this_00 = (TableViewSectionPrivate *)operator_new(0x60);
  TableViewSectionPrivate::TableViewSectionPrivate(this_00,this);
  QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
            ::operator->(&this->d);
  TableViewSectionPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

TableViewSection::TableViewSection( QWidget * parent )
	:	QWidget( parent )
	,	d( new TableViewSectionPrivate( this ) )
{
	d->init();
}